

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sigmund~.c
# Opt level: O0

void sigmund_list(t_sigmund *x,t_symbol *s,int argc,t_atom *argv)

{
  int iVar1;
  t_float tVar2;
  t_float tVar3;
  t_word *local_78;
  t_word *wordarray;
  t_float *ptStack_68;
  t_float pit;
  t_float *arraypoints;
  _garray *a;
  int local_50;
  int bufsize;
  int i;
  int nfound;
  int totstorage;
  int arraysize;
  int loud;
  t_float srate;
  int onset;
  int npts;
  t_symbol *syminput;
  t_atom *argv_local;
  t_symbol *ptStack_18;
  int argc_local;
  t_symbol *s_local;
  t_sigmund *x_local;
  
  syminput = (t_symbol *)argv;
  argv_local._4_4_ = argc;
  ptStack_18 = s;
  s_local = (t_symbol *)x;
  _onset = atom_getsymbolarg(0,argc,argv);
  tVar2 = atom_getfloatarg(1,argv_local._4_4_,(t_atom *)syminput);
  srate = (t_float)(int)tVar2;
  tVar2 = atom_getfloatarg(2,argv_local._4_4_,(t_atom *)syminput);
  loud = (int)tVar2;
  arraysize = (int)atom_getfloatarg(3,argv_local._4_4_,(t_atom *)syminput);
  tVar3 = atom_getfloatarg(4,argv_local._4_4_,(t_atom *)syminput);
  tVar2 = srate;
  totstorage = (int)tVar3;
  local_78 = (t_word *)0x0;
  if (argv_local._4_4_ < 5) {
    post("sigmund: array-name, npts, array-onset, samplerate, loud");
    return;
  }
  if (((int)srate < 0x40) ||
     (iVar1 = ilog2((int)srate), tVar2 != (t_float)(1 << ((byte)iVar1 & 0x1f)))) {
    pd_error((void *)0x0,"sigmund: bad npoints");
    return;
  }
  if (loud < 0) {
    pd_error((void *)0x0,"sigmund: negative onset");
    return;
  }
  if (0.0 < (float)arraysize) {
    a._4_4_ = (int)srate << 2;
    ptStack_68 = (t_float *)getbytes((long)a._4_4_);
    arraypoints = (t_float *)pd_findbyclass(_onset,garray_class);
    if ((((_garray *)arraypoints == (_garray *)0x0) ||
        (iVar1 = garray_getfloatwords((_garray *)arraypoints,&nfound,&local_78), iVar1 == 0)) ||
       (nfound < loud + (int)srate)) {
      pd_error((void *)0x0,"%s: array missing or too small",_onset->s_name);
    }
    else if (nfound < (int)srate) {
      pd_error((void *)0x0,"sigmund~: too few points in array");
    }
    else {
      for (local_50 = 0; local_50 < (int)srate; local_50 = local_50 + 1) {
        ptStack_68[local_50] = local_78[local_50 + loud].w_float;
      }
      sigmund_doit((t_sigmund *)s_local,(int)srate,ptStack_68,totstorage,(t_float)arraysize);
    }
    freebytes(ptStack_68,(long)a._4_4_);
    return;
  }
  pd_error((void *)0x0,"sigmund: bad samplerate");
  return;
}

Assistant:

static void sigmund_list(t_sigmund *x, t_symbol *s, int argc, t_atom *argv)
{
    t_symbol *syminput = atom_getsymbolarg(0, argc, argv);
    int npts = atom_getfloatarg(1, argc, argv);
    int onset = atom_getfloatarg(2, argc, argv);
    t_float srate = atom_getfloatarg(3, argc, argv);
    int loud = atom_getfloatarg(4, argc, argv);
    int arraysize, totstorage, nfound, i, bufsize;
    t_garray *a;
    t_float *arraypoints, pit;
    t_word *wordarray = 0;
    if (argc < 5)
    {
        post(
         "sigmund: array-name, npts, array-onset, samplerate, loud");
        return;
    }
    if (npts < 64 || npts != (1 << ilog2(npts))) 
    {
        pd_error(0, "sigmund: bad npoints");
        return;
    }
    if (onset < 0)
    {
        pd_error(0, "sigmund: negative onset");
        return;
    }
    if (srate <= 0)
    {
        pd_error(0, "sigmund: bad samplerate");
        return;
    }
    bufsize = sizeof(t_float)*npts;
    arraypoints = (t_float *)getbytes(bufsize);
    if (!(a = (t_garray *)pd_findbyclass(syminput, garray_class)) ||
        !garray_getfloatwords(a, &arraysize, &wordarray) ||
            arraysize < onset + npts)
    {
        pd_error(0, "%s: array missing or too small", syminput->s_name);
        goto cleanup;
    }
    if (arraysize < npts)
    {
        pd_error(0, "sigmund~: too few points in array");
        goto cleanup;
    }
    for (i = 0; i < npts; i++)
        arraypoints[i] = wordarray[i+onset].w_float;
    sigmund_doit(x, npts, arraypoints, loud, srate);
cleanup:
    freebytes(arraypoints, bufsize);
}